

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O0

void QtPrivate::BindableWarnings::printMetaTypeMismatch(QMetaType actual,QMetaType expected)

{
  bool bVar1;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff58;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff60;
  int line;
  char *in_stack_ffffffffffffff68;
  QMessageLogger *in_stack_ffffffffffffff70;
  QMessageLogger *in_stack_ffffffffffffff78;
  QDebug *this;
  QDebug *in_stack_ffffffffffffffa8;
  QDebug local_50;
  char *in_stack_ffffffffffffffb8;
  QMetaType local_28;
  QMetaType local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcQPropertyBinding();
  anon_unknown.dwarf_71fbad::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  while( true ) {
    line = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_71fbad::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x416232);
    this = &local_50;
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,line,
               (char *)in_stack_ffffffffffffff58,(char *)0x41624b);
    QMessageLogger::warning(in_stack_ffffffffffffff78);
    QDebug::operator<<(this,in_stack_ffffffffffffffb8);
    QMetaType::name(&local_20);
    in_stack_ffffffffffffff78 = (QMessageLogger *)QDebug::operator<<(this,in_stack_ffffffffffffffb8)
    ;
    in_stack_ffffffffffffff70 = (QMessageLogger *)QDebug::operator<<(this,in_stack_ffffffffffffffb8)
    ;
    in_stack_ffffffffffffff68 = QMetaType::name(&local_28);
    in_stack_ffffffffffffff60 =
         (QLoggingCategoryMacroHolder<(QtMsgType)1> *)
         QDebug::operator<<(this,in_stack_ffffffffffffffb8);
    QDebug::operator<<(this,in_stack_ffffffffffffffb8);
    QDebug::~QDebug(in_stack_ffffffffffffffa8);
    local_10 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void printMetaTypeMismatch(QMetaType actual, QMetaType expected)
{
    qCWarning(lcQPropertyBinding) << "setBinding: Could not set binding as the property expects it to be of type"
                                  << actual.name()
                                  << "but got" << expected.name() << "instead.";
}